

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hudmessages.cpp
# Opt level: O0

void __thiscall
DHUDMessage::DHUDMessage
          (DHUDMessage *this,FFont *font,char *text,float x,float y,int hudwidth,int hudheight,
          EColorRange textColor,float holdTime)

{
  uint uVar1;
  char *pcVar2;
  float fVar3;
  double dVar4;
  float local_64;
  float local_60;
  float local_48;
  int fracpart;
  float intpart;
  float local_38;
  EColorRange local_34;
  float holdTime_local;
  EColorRange textColor_local;
  int hudheight_local;
  int hudwidth_local;
  float y_local;
  float x_local;
  char *text_local;
  FFont *font_local;
  DHUDMessage *this_local;
  
  local_38 = holdTime;
  local_34 = textColor;
  holdTime_local = (float)hudheight;
  textColor_local = hudwidth;
  hudheight_local = (int)y;
  hudwidth_local = (int)x;
  _y_local = text;
  text_local = (char *)font;
  font_local = (FFont *)this;
  DObject::DObject(&this->super_DObject);
  (this->super_DObject)._vptr_DObject = (_func_int **)&PTR_StaticType_00a06420;
  TObjPtr<DHUDMessage>::TObjPtr(&this->Next);
  if ((textColor_local == CR_BRICK) || (holdTime_local == 0.0)) {
    this->HUDHeight = 0;
    this->HUDWidth = 0;
    dVar4 = std::fabs((double)(ulong)(uint)hudwidth_local);
    if (SUB84(dVar4,0) <= 2.0) {
      if (-1.0 <= (float)hudwidth_local) {
        if ((float)hudwidth_local <= 1.0) {
          local_64 = (float)hudwidth_local;
        }
        else {
          local_64 = (float)hudwidth_local - 1.0;
        }
        local_60 = local_64;
      }
      else {
        local_60 = (float)hudwidth_local + 1.0;
      }
      this->Left = local_60;
      dVar4 = std::fabs((double)(ulong)(uint)hudwidth_local);
      if (SUB84(dVar4,0) <= 1.0) {
        this->CenterX = false;
      }
      else {
        this->CenterX = true;
      }
    }
    else {
      this->CenterX = true;
      this->Left = 0.5;
    }
  }
  else {
    this->Top = (float)hudheight_local;
    this->HUDWidth = textColor_local;
    this->HUDHeight = (int)holdTime_local;
    fVar3 = modff((float)hudwidth_local,&local_48);
    uVar1 = (uint)(ABS(fVar3) * 10.0 + 0.5);
    if ((uVar1 & 4) == 0) {
      this->CenterX = false;
    }
    else {
      this->CenterX = true;
    }
    if ((float)hudwidth_local <= 0.0) {
      this->Left = local_48 - (float)(uVar1 & 3) / 10.0;
    }
    else {
      this->Left = local_48 + (float)(uVar1 & 3) / 10.0;
    }
  }
  this->NoWrap = false;
  this->ClipHeight = 0;
  this->ClipWidth = 0;
  this->ClipY = 0;
  this->ClipX = 0;
  this->WrapWidth = 0;
  this->HandleAspect = true;
  this->Top = (float)hudheight_local;
  TObjPtr<DHUDMessage>::operator=(&this->Next,(DHUDMessage *)0x0);
  this->Lines = (FBrokenLines *)0x0;
  this->HoldTics = (int)(local_38 * 35.0);
  this->Tics = 0;
  this->TextColor = local_34;
  this->State = 0;
  pcVar2 = copystring(_y_local);
  this->SourceText = pcVar2;
  this->Font = (FFont *)text_local;
  this->VisibilityFlags = 0;
  FRenderStyle::operator=((FRenderStyle *)&(this->Style).field_0,STYLE_Translucent);
  this->Alpha = 1.0;
  (*(this->super_DObject)._vptr_DObject[7])(this,this->SourceText);
  return;
}

Assistant:

DHUDMessage::DHUDMessage (FFont *font, const char *text, float x, float y, int hudwidth, int hudheight,
						  EColorRange textColor, float holdTime)
{
	if (hudwidth == 0 || hudheight == 0)
	{
		// for y range [-1.0, 0.0]: Positions top edge of box
		// for y range [0.0, 1.0]: Positions center of box
		// for x range [-2.0, -1.0]: Positions left edge of box, and centers text inside it
		// for x range [-1.0, 0.0]: Positions left edge of box
		// for x range [0.0, 1.0]: Positions center of box
		// for x range [1.0, 2.0]: Positions center of box, and centers text inside it
		HUDWidth = HUDHeight = 0;
		if (fabs (x) > 2.f)
		{
			CenterX = true;
			Left = 0.5f;
		}
		else
		{
			Left = x < -1.f ? x + 1.f : x > 1.f ? x - 1.f : x;
			if (fabs(x) > 1.f)
			{
				CenterX = true;
			}
			else
			{
				CenterX = false;
			}
		}
	}
	else
	{ // HUD size is specified, so coordinates are in pixels, but you can add
	  // some fractions to affect positioning:
	  // For y: .1 = positions top edge of box
	  //		.2 = positions bottom edge of box
	  // For x: .1 = positions left edge of box
	  //        .2 = positions right edge of box
	  //		.4 = centers text inside box
	  //			 .4 can also be added to either .1 or .2
		Top = y;
		HUDWidth = hudwidth;
		HUDHeight = hudheight;
		
		float intpart;
		int fracpart = (int)(fabsf (modff (x, &intpart)) * 10.f + 0.5f);
		if (fracpart & 4)
		{
			CenterX = true;
		}
		else
		{
			CenterX = false;
		}
		if (x > 0)
		{
			Left = intpart + (float)(fracpart & 3) / 10.f;
		}
		else
		{
			Left = intpart - (float)(fracpart & 3) / 10.f;
		}
	}
	NoWrap = false;
	ClipX = ClipY = ClipWidth = ClipHeight = 0;
	WrapWidth = 0;
	HandleAspect = true;
	Top = y;
	Next = NULL;
	Lines = NULL;
	HoldTics = (int)(holdTime * TICRATE);
	Tics = 0;
	TextColor = textColor;
	State = 0;
	SourceText = copystring (text);
	Font = font;
	VisibilityFlags = 0;
	Style = STYLE_Translucent;
	Alpha = 1.;
	ResetText (SourceText);
}